

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_impl.h
# Opt level: O1

size_t __thiscall
SketchImpl<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>_>
::Merge(SketchImpl<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>_>
        *this,Sketch *other_sketch)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  uint64_t uVar4;
  ulong uVar5;
  size_t sVar6;
  ulong __new_size;
  long lVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (long)(this->m_syndromes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_syndromes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start >> 2;
  __new_size = (long)(*(long *)&other_sketch[1].m_implementation - other_sketch[1].m_canary) >> 2;
  if (uVar5 <= __new_size) {
    __new_size = uVar5;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->m_syndromes,__new_size);
  puVar2 = (this->m_syndromes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->m_syndromes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  sVar6 = (long)puVar3 - (long)puVar2 >> 2;
  if (puVar3 != puVar2) {
    uVar4 = other_sketch[1].m_canary;
    lVar7 = 0;
    do {
      puVar2[lVar7] = puVar2[lVar7] ^ *(uint *)(uVar4 + lVar7 * 4);
      lVar7 = lVar7 + 1;
    } while (sVar6 + (sVar6 == 0) != lVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return sVar6;
  }
  __stack_chk_fail();
}

Assistant:

size_t Merge(const Sketch* other_sketch) override
    {
        // Sad cast. This is safe only because the caller code in minisketch.cpp checks
        // that implementation and field size match.
        const SketchImpl* other = static_cast<const SketchImpl*>(other_sketch);
        m_syndromes.resize(std::min(m_syndromes.size(), other->m_syndromes.size()));
        for (size_t i = 0; i < m_syndromes.size(); ++i) {
            m_syndromes[i] ^= other->m_syndromes[i];
        }
        return m_syndromes.size();
    }